

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath_p.h
# Opt level: O2

void __thiscall QPainterPathPrivate::clear(QPainterPathPrivate *this)

{
  QList<QPainterPath::Element>::clear(&this->elements);
  QList<double>::clear(&this->m_runLengths);
  this->cStart = 0;
  (this->bounds).xp = 0.0;
  (this->bounds).yp = 0.0;
  (this->bounds).w = 0.0;
  (this->bounds).h = 0.0;
  (this->controlBounds).xp = 0.0;
  (this->controlBounds).yp = 0.0;
  (this->controlBounds).w = 0.0;
  (this->controlBounds).h = 0.0;
  this->field_0x84 = this->field_0x84 & 0xe0;
  std::__uniq_ptr_impl<QVectorPathConverter,_std::default_delete<QVectorPathConverter>_>::reset
            ((__uniq_ptr_impl<QVectorPathConverter,_std::default_delete<QVectorPathConverter>_> *)
             &this->pathConverter,(pointer)0x0);
  return;
}

Assistant:

inline void QPainterPathPrivate::clear()
{
    Q_ASSERT(ref.loadRelaxed() == 1);

    elements.clear();
    m_runLengths.clear();

    cStart = 0;
    bounds = {};
    controlBounds = {};

    require_moveTo = false;
    dirtyBounds = false;
    dirtyControlBounds = false;
    dirtyRunLengths = false;
    convex = false;

    pathConverter.reset();
}